

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestIOSystem.h
# Opt level: O0

IOStream * __thiscall Assimp::TestIOSystem::Open(TestIOSystem *this,char *pFile,char *pMode)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_80;
  Message local_78;
  void *local_70;
  undefined1 local_68 [8];
  AssertionResult gtest_ar_1;
  Message local_40;
  void *local_38;
  undefined1 local_30 [8];
  AssertionResult gtest_ar;
  char *pMode_local;
  char *pFile_local;
  TestIOSystem *this_local;
  
  local_38 = (void *)0x0;
  gtest_ar.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pMode;
  pMode_local = pFile;
  pFile_local = (char *)this;
  testing::internal::CmpHelperNE<decltype(nullptr),char_const*>
            ((internal *)local_30,"nullptr","pFile",&local_38,&pMode_local);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_30);
  if (!bVar1) {
    testing::Message::Message(&local_40);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_30);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/TestIOSystem.h"
               ,0x4a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_40);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
  local_70 = (void *)0x0;
  testing::internal::CmpHelperNE<decltype(nullptr),char_const*>
            ((internal *)local_68,"nullptr","pMode",&local_70,(char **)&gtest_ar.message_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_68);
  if (!bVar1) {
    testing::Message::Message(&local_78);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_68);
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/TestIOSystem.h"
               ,0x4b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_80,&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    testing::Message::~Message(&local_78);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_68);
  return (IOStream *)0x0;
}

Assistant:

virtual IOStream* Open( const char* pFile, const char* pMode = "rb" ) {
        EXPECT_NE( nullptr, pFile );
        EXPECT_NE( nullptr, pMode );
        return NULL;
    }